

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var * __thiscall
cs::structure::get_var<std::__cxx11::string_const&>
          (structure *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  bool bVar1;
  var *pvVar2;
  string *str;
  string *in_RSI;
  domain_type *in_RDI;
  string *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 uVar3;
  domain_type *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  
  std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x42a6fd);
  bVar1 = domain_type::exist(in_RDI,in_stack_ffffffffffffff28);
  if (!bVar1) {
    uVar3 = 1;
    str = (string *)__cxa_allocate_exception(0x28);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffff38),(char *)in_RDI);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff40,in_RSI);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffff38),(char *)in_RDI);
    runtime_error::runtime_error((runtime_error *)in_RDI,str);
    __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x42a721);
  pvVar2 = domain_type::get_var_no_check
                     (in_stack_ffffffffffffff40,
                      (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  return pvVar2;
}

Assistant:

var &get_var(T &&name) const
		{
			if (m_data->exist(name))
				return m_data->get_var_no_check(name);
			else
				throw runtime_error("Struct \"" + m_name + "\" have no member called \"" + std::string(name) + "\".");
		}